

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetBooleanVerifier::verifyIntegerLessOrEqual
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLint reference)

{
  bool bVar1;
  StateQueryMemoryWriteGuard<unsigned_char> state;
  StateQueryMemoryWriteGuard<unsigned_char> local_19b;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_19b.m_preguard = 0xde;
  local_19b.m_value = 0xde;
  local_19b.m_postguard = 0xde;
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&local_19b.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&local_19b,testCtx);
  if ((bVar1) && (local_19b.m_value != '\x01')) {
    if (local_19b.m_value == '\0') {
      if (-1 < reference) {
        return;
      }
      local_198._0_8_ = testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 8),"// ERROR: expected GL_TRUE",0x1a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_198._0_8_ = testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 8),"// ERROR: expected GL_TRUE or GL_FALSE",0x26);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_198 + 8));
    std::ios_base::~ios_base(local_120);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyIntegerLessOrEqual (tcu::TestContext& testCtx, GLenum name, GLint reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean> state;
	glGetBooleanv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state == GL_TRUE) // state is non-zero, could be less than reference (correct)
		return;

	if (state == GL_FALSE) // state is zero
	{
		if (reference < 0) // and reference is less than zero?
		{
			testCtx.getLog() << TestLog::Message << "// ERROR: expected GL_TRUE" << TestLog::EndMessage;
			if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
		}
	}
	else
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected GL_TRUE or GL_FALSE" << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}